

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_literals.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressRleLiteralsBlock
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  long lVar1;
  
  lVar1 = ((ulong)(0x1f < srcSize) - (ulong)(srcSize < 0x1000)) + 2;
  if (lVar1 == 3) {
    *(uint *)dst = (int)srcSize << 4 | 0xd;
  }
  else if ((int)lVar1 == 2) {
    *(ushort *)dst = (ushort)((int)srcSize << 4) | 5;
  }
  else {
    *(char *)dst = (char)srcSize * '\b' + '\x01';
  }
  *(undefined1 *)((long)dst + lVar1) = *src;
  return (ulong)((int)lVar1 + 1);
}

Assistant:

size_t ZSTD_compressRleLiteralsBlock (void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
    BYTE* const ostart = (BYTE*)dst;
    U32   const flSize = 1 + (srcSize>31) + (srcSize>4095);

    assert(dstCapacity >= 4); (void)dstCapacity;
    assert(allBytesIdentical(src, srcSize));

    switch(flSize)
    {
        case 1: /* 2 - 1 - 5 */
            ostart[0] = (BYTE)((U32)set_rle + (srcSize<<3));
            break;
        case 2: /* 2 - 2 - 12 */
            MEM_writeLE16(ostart, (U16)((U32)set_rle + (1<<2) + (srcSize<<4)));
            break;
        case 3: /* 2 - 2 - 20 */
            MEM_writeLE32(ostart, (U32)((U32)set_rle + (3<<2) + (srcSize<<4)));
            break;
        default:   /* not necessary : flSize is {1,2,3} */
            assert(0);
    }

    ostart[flSize] = *(const BYTE*)src;
    DEBUGLOG(5, "RLE : Repeated Literal (%02X: %u times) -> %u bytes encoded", ((const BYTE*)src)[0], (U32)srcSize, (U32)flSize + 1);
    return flSize+1;
}